

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O2

int main(void)

{
  uint32_t uVar1;
  uint uVar2;
  testvalue_t tv;
  testvalue_t tv_00;
  testvalue_t tv_01;
  int iVar3;
  int iVar4;
  uint uVar5;
  _Bool _Var6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  roaring_bitmap_t *prVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  timespec ts;
  uint local_4c;
  timespec ts_4;
  
  uVar5 = local_4c;
  for (lVar15 = 0; lVar15 != 0xc80; lVar15 = lVar15 + 0x20) {
    uVar8 = ranged_random(0xfffffffe);
    uVar9 = ranged_random(0xffffffff);
    uVar10 = ranged_random(0xffff);
    uVar1 = uVar9;
    if (uVar8 >= uVar9 && uVar8 != uVar9) {
      uVar1 = uVar8;
    }
    uVar2 = uVar9;
    if (uVar8 < uVar9) {
      uVar2 = uVar8;
    }
    uVar13 = (uVar8 == uVar9) + uVar1;
    *(uint *)((long)&DAT_0012a0f8 + lVar15) = uVar2;
    *(uint *)((long)&DAT_0012a0fc + lVar15) = uVar13;
    *(uint32_t *)((long)&DAT_0012a100 + lVar15) = uVar10;
    prVar11 = roaring_bitmap_from_range((ulong)uVar2,(ulong)uVar13,uVar10);
    *(roaring_bitmap_t **)((long)&run_test_testvalues + lVar15) = prVar11;
    uVar8 = ranged_random(0xfffffffe);
    pvVar14 = (void *)0xffffffff;
    uVar9 = ranged_random(0xffffffff);
    uVar1 = uVar9;
    if (uVar8 < uVar9) {
      uVar1 = uVar8;
    }
    uVar10 = uVar9;
    if (uVar9 < uVar8) {
      uVar10 = uVar8;
    }
    *(uint32_t *)((long)&DAT_0012a104 + lVar15) = uVar1;
    *(uint *)((long)&DAT_0012a108 + lVar15) = (uVar8 == uVar9) + uVar10;
    _Var6 = naive_intersect(pvVar14,*(testvalue_t *)((long)&run_test_testvalues + lVar15));
    (&DAT_0012a10c)[lVar15] = _Var6;
  }
  puts("  roaring_bitmap_from_range():");
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  iVar12 = 0;
  for (lVar15 = 0; lVar15 != 0xc80; lVar15 = lVar15 + 0x20) {
    pvVar14 = (void *)0x3;
    clock_gettime(3,(timespec *)&ts);
    iVar3 = (int)ts.tv_sec;
    iVar4 = (int)ts.tv_nsec;
    naive_intersect(pvVar14,*(testvalue_t *)((long)&run_test_testvalues + lVar15));
    clock_gettime(3,(timespec *)&ts);
    iVar12 = iVar12 + ((int)ts.tv_nsec - iVar4) + ((int)ts.tv_sec - iVar3) * 1000000000;
  }
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar12 / 100.0),0));
  putchar(10);
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  iVar12 = 0;
  for (lVar15 = 0; lVar15 != 0xc80; lVar15 = lVar15 + 0x20) {
    pvVar14 = (void *)0x3;
    clock_gettime(3,(timespec *)&ts);
    iVar3 = (int)ts.tv_sec;
    iVar4 = (int)ts.tv_nsec;
    range_intersect(pvVar14,*(testvalue_t *)((long)&run_test_testvalues + lVar15));
    clock_gettime(3,(timespec *)&ts);
    iVar12 = iVar12 + ((int)ts.tv_nsec - iVar4) + ((int)ts.tv_sec - iVar3) * 1000000000;
  }
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar12 / 100.0),0));
  putchar(10);
  fflush((FILE *)0x0);
  for (lVar15 = 0; lVar15 != 0xc80; lVar15 = lVar15 + 0x20) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)&run_test_testvalues + lVar15));
  }
  iVar12 = 0;
  pvVar14 = (void *)0x0;
  prVar11 = roaring_bitmap_from_range(0,0xfffffffe,2);
  ts.tv_nsec = -0x200000000;
  local_4c = local_4c & 0xffffff00;
  tv._28_4_ = local_4c;
  tv.range[1] = 0xffffffff;
  tv.bitmap_range[0] = 0;
  tv.bitmap_range[1] = 0xfffffffe;
  tv.bitmap = prVar11;
  tv.bitmap_range[2] = 2;
  tv.range[0] = 0xfffffffd;
  ts.tv_sec = (__time_t)prVar11;
  _Var6 = naive_intersect(pvVar14,tv);
  local_4c = CONCAT31(SUB43(uVar5,1),_Var6);
  puts("  roaring_bitmap_from_range():");
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  bVar7 = true;
  while (bVar7) {
    pvVar14 = (void *)0x3;
    clock_gettime(3,(timespec *)&ts_4);
    iVar4 = (int)ts_4.tv_nsec;
    iVar3 = (int)ts_4.tv_sec;
    tv_00._28_4_ = local_4c;
    tv_00.range[1] = 0xffffffff;
    tv_00.bitmap_range[0] = (int)ts.tv_nsec;
    tv_00.bitmap_range[1] = ts.tv_nsec._4_4_;
    tv_00.bitmap = (roaring_bitmap_t *)ts.tv_sec;
    tv_00.bitmap_range[2] = 2;
    tv_00.range[0] = 0xfffffffd;
    naive_intersect(pvVar14,tv_00);
    clock_gettime(3,(timespec *)&ts_4);
    iVar12 = iVar12 + ((int)ts_4.tv_nsec - iVar4) + ((int)ts_4.tv_sec - iVar3) * 1000000000;
    bVar7 = false;
  }
  bVar7 = true;
  printf(" %.2f cycles per operation",SUB84((double)iVar12,0));
  putchar(10);
  iVar12 = 0;
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  while (bVar7) {
    pvVar14 = (void *)0x3;
    clock_gettime(3,(timespec *)&ts_4);
    iVar4 = (int)ts_4.tv_nsec;
    iVar3 = (int)ts_4.tv_sec;
    tv_01._28_4_ = local_4c;
    tv_01.range[1] = 0xffffffff;
    tv_01.bitmap_range[0] = (int)ts.tv_nsec;
    tv_01.bitmap_range[1] = ts.tv_nsec._4_4_;
    tv_01.bitmap = (roaring_bitmap_t *)ts.tv_sec;
    tv_01.bitmap_range[2] = 2;
    tv_01.range[0] = 0xfffffffd;
    range_intersect(pvVar14,tv_01);
    clock_gettime(3,(timespec *)&ts_4);
    iVar12 = iVar12 + ((int)ts_4.tv_nsec - iVar4) + ((int)ts_4.tv_sec - iVar3) * 1000000000;
    bVar7 = false;
  }
  printf(" %.2f cycles per operation",SUB84((double)iVar12,0));
  putchar(10);
  fflush((FILE *)0x0);
  roaring_bitmap_free(prVar11);
  return 0;
}

Assistant:

int main(void) {
    run_test();
    return 0;
}